

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

Point3f __thiscall pbrt::AnimatedTransform::operator()(AnimatedTransform *this,Point3f p,Float time)

{
  undefined1 auVar1 [64];
  Tuple3<pbrt::Point3,_float> TVar2;
  Transform t;
  Tuple3<pbrt::Point3,_float> local_98;
  
  local_98.z = p.super_Tuple3<pbrt::Point3,_float>.z;
  auVar1._8_56_ = p._8_56_;
  auVar1._0_8_ = p.super_Tuple3<pbrt::Point3,_float>._0_8_;
  local_98._0_8_ = vmovlps_avx(auVar1._0_16_);
  if ((this->actuallyAnimated == true) && (this->startTime < time)) {
    if (time < this->endTime) {
      Interpolate((Transform *)&stack0xffffffffffffff78,this,time);
      this = (AnimatedTransform *)&stack0xffffffffffffff78;
    }
    else {
      this = (AnimatedTransform *)&this->endTransform;
    }
  }
  TVar2 = (Tuple3<pbrt::Point3,_float>)
          Transform::operator()(&this->startTransform,(Point3<float> *)&local_98);
  return (Point3f)TVar2;
}

Assistant:

Point3f AnimatedTransform::operator()(Point3f p, Float time) const {
    if (!actuallyAnimated || time <= startTime)
        return startTransform(p);
    else if (time >= endTime)
        return endTransform(p);
    Transform t = Interpolate(time);
    return t(p);
}